

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.h
# Opt level: O3

void __thiscall Heuristics::Heuristics(Heuristics *this)

{
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_first = (_Elt_pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_last = (_Elt_pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_start._M_node = (_Map_pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_start._M_first = (_Elt_pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_start._M_last = (_Elt_pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_map_size = 0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_start._M_cur = (_Elt_pointer)0x0;
  (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_map = (_Map_pointer)0x0;
  (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<Table,_std::allocator<Table>_>::_M_initialize_map
            ((_Deque_base<Table,_std::allocator<Table>_> *)&this->frontier,0);
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->frontierQ).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Table,_std::allocator<Table>_>::_M_initialize_map
            ((_Deque_base<Table,_std::allocator<Table>_> *)&this->frontierQ,0);
  (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->targetState).current_row = 1;
  (this->targetState).current_col = 1;
  (this->targetState).table[0][0] = '1';
  (this->targetState).table[0][1] = '2';
  (this->targetState).table[0][2] = '3';
  (this->targetState).table[1][0] = '4';
  (this->targetState).table[1][1] = '5';
  (this->targetState).table[1][2] = '6';
  (this->targetState).table[2][0] = '7';
  (this->targetState).table[2][1] = '8';
  (this->targetState).table[2][2].number = ' ';
  return;
}

Assistant:

Heuristics(){
        targetState.table[0][0] = Cell('1');
        targetState.table[0][1] = Cell('2');
        targetState.table[0][2] = Cell('3');
        targetState.table[1][0] = Cell('4');
        targetState.table[1][1] = Cell('5');
        targetState.table[1][2] = Cell('6');
        targetState.table[2][0] = Cell('7');
        targetState.table[2][1] = Cell('8');
        targetState.table[2][2] = Cell(' ');
    }